

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionOperators.cpp
# Opt level: O1

StackTrace *
Js::JavascriptExceptionOperators::TrimStackTraceForThrownObject
          (StackTrace *stackTraceIn,Var thrownObject,ScriptContext *scriptContext)

{
  Type *pTVar1;
  Type pRVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  uint64 uVar7;
  Recycler *alloc;
  List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this;
  Type *other;
  int iVar8;
  int i;
  int index;
  undefined1 local_60 [8];
  TrackAllocData data;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if ((DAT_015d3474 != '\x01') || (scriptContext->threadContext->hasCatchHandler == true)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x584,"(CrawlStackForWER(scriptContext))","CrawlStackForWER(scriptContext)")
    ;
    if (!bVar4) goto LAB_00aa4153;
    *puVar6 = 0;
  }
  if (stackTraceIn == (StackTrace *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x585,"(stackTraceIn)","stackTraceIn");
    if (!bVar4) goto LAB_00aa4153;
    *puVar6 = 0;
  }
  uVar7 = GetStackTraceLimit(thrownObject,scriptContext);
  iVar8 = (int)uVar7;
  if ((iVar8 != 0) && (bVar4 = IsErrorInstance(thrownObject), !bVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                       ,0x588,"(stackTraceLimit == 0 || IsErrorInstance(thrownObject))",
                       "stackTraceLimit == 0 || IsErrorInstance(thrownObject)");
    if (!bVar4) goto LAB_00aa4153;
    *puVar6 = 0;
  }
  if (iVar8 < (stackTraceIn->
              super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
              ).count) {
    if (iVar8 < 1) {
      stackTraceIn = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)0x0;
    }
    else {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&data.field_0x24,
                 ExceptionType_JavascriptException|ExceptionType_StackOverflow|
                 ExceptionType_OutOfMemory);
      local_60 = (undefined1  [8])
                 &JsUtil::
                  List<Js::JavascriptExceptionContext::StackFrame,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                  ::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_4dc7e95;
      data.filename._0_4_ = 0x595;
      alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_60);
      index = 0;
      this = (List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,alloc,0x38bbb2);
      pRVar2 = scriptContext->recycler;
      (this->
      super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
      ).buffer.ptr = (StackFrame *)0x0;
      (this->
      super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
      ).count = 0;
      (this->
      super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
      ).alloc = pRVar2;
      (this->
      super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
      )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ffb98;
      this->length = 0;
      this->increment = 4;
      do {
        other = JsUtil::
                List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ::Item(stackTraceIn,index);
        JsUtil::
        List<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(this,0);
        JavascriptExceptionContext::StackFrame::operator=
                  ((this->
                   super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                   ).buffer.ptr +
                   (this->
                   super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                   ).count,other);
        pTVar1 = &(this->
                  super_ReadOnlyList<Js::JavascriptExceptionContext::StackFrame,_Memory::Recycler,_DefaultComparer>
                  ).count;
        *pTVar1 = *pTVar1 + 1;
        index = index + 1;
      } while (iVar8 != index);
      BVar5 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionOperators.cpp"
                           ,0x59b,"(JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                           "JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
        if (!bVar4) {
LAB_00aa4153:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                ((AutoNestedHandledExceptionType *)&data.field_0x24);
      stackTraceIn = this;
    }
  }
  return stackTraceIn;
}

Assistant:

JavascriptExceptionContext::StackTrace* JavascriptExceptionOperators::TrimStackTraceForThrownObject(JavascriptExceptionContext::StackTrace* stackTraceIn, Var thrownObject, ScriptContext& scriptContext)
    {
        Assert(CrawlStackForWER(scriptContext)); // Don't trim if crawl for Error.stack
        Assert(stackTraceIn);

        int stackTraceLimit = static_cast<int>(GetStackTraceLimit(thrownObject, &scriptContext));
        Assert(stackTraceLimit == 0 || IsErrorInstance(thrownObject));

        if (stackTraceIn->Count() <= stackTraceLimit)
        {
            return stackTraceIn;
        }

        JavascriptExceptionContext::StackTrace* stackTraceTrimmed = NULL;
        if (stackTraceLimit > 0)
        {
            HRESULT hr;
            BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_NESTED
            {
                stackTraceTrimmed = RecyclerNew(scriptContext.GetRecycler(), JavascriptExceptionContext::StackTrace, scriptContext.GetRecycler());
                for (int i = 0; i < stackTraceLimit; i++)
                {
                    stackTraceTrimmed->Add(stackTraceIn->Item(i));
                }
            }
            END_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT_INSCRIPT(hr);
        }